

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O2

void __thiscall TPZMHMeshControl::~TPZMHMeshControl(TPZMHMeshControl *this)

{
  TPZAutoPointer<TPZCompMesh> *this_00;
  TPZCompEl *pTVar1;
  long lVar2;
  TPZGeoEl *pTVar3;
  long lVar4;
  int64_t el;
  long lVar5;
  
  this->_vptr_TPZMHMeshControl = (_func_int **)&PTR__TPZMHMeshControl_01815f70;
  TPZGeoMesh::ResetReference(((this->fGMesh).fRef)->fPointer);
  this_00 = &this->fCMesh;
  lVar4 = (((this->fCMesh).fRef)->fPointer->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.
          fNElements;
  lVar5 = 0;
  if (lVar4 < 1) {
    lVar4 = lVar5;
  }
  for (; lVar4 != lVar5; lVar5 = lVar5 + 1) {
    pTVar1 = TPZCompMesh::Element(this_00->fRef->fPointer,lVar5);
    if ((pTVar1 != (TPZCompEl *)0x0) &&
       (lVar2 = __dynamic_cast(pTVar1,&TPZCompEl::typeinfo,&TPZSubCompMesh::typeinfo,0x918),
       lVar2 != 0)) {
      (**(code **)(*(long *)pTVar1 + 8))(pTVar1);
    }
  }
  for (lVar5 = 0; lVar4 != lVar5; lVar5 = lVar5 + 1) {
    pTVar1 = TPZCompMesh::Element(this_00->fRef->fPointer,lVar5);
    if ((pTVar1 != (TPZCompEl *)0x0) &&
       (pTVar3 = TPZCompEl::Reference(pTVar1), pTVar3 != (TPZGeoEl *)0x0)) {
      (**(code **)(*(long *)pTVar1 + 0x68))(pTVar1);
      (**(code **)(*(long *)pTVar1 + 8))(pTVar1);
    }
  }
  std::
  _Rb_tree<TPZCompMesh_*,_std::pair<TPZCompMesh_*const,_TPZManVector<long,_10>_>,_std::_Select1st<std::pair<TPZCompMesh_*const,_TPZManVector<long,_10>_>_>,_std::less<TPZCompMesh_*>,_std::allocator<std::pair<TPZCompMesh_*const,_TPZManVector<long,_10>_>_>_>
  ::~_Rb_tree(&(this->fConnectToSubDomainIdentifier)._M_t);
  std::
  _Rb_tree<long,_std::pair<const_long,_std::pair<long,_long>_>,_std::_Select1st<std::pair<const_long,_std::pair<long,_long>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
  ::~_Rb_tree(&(this->fInterfaces)._M_t);
  std::
  _Rb_tree<long,_std::pair<const_long,_long>,_std::_Select1st<std::pair<const_long,_long>_>,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
  ::~_Rb_tree(&(this->fMHMtoSubCMesh)._M_t);
  TPZManVector<long,_10>::~TPZManVector(&this->fGeoToMHMDomain);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&(this->fMaterialBCIds)._M_t);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&(this->fMaterialIds)._M_t);
  TPZAutoPointer<TPZCompMesh>::~TPZAutoPointer(&this->fPressureFineMesh);
  TPZAutoPointer<TPZCompMesh>::~TPZAutoPointer(&this->fCMeshConstantPressure);
  TPZAutoPointer<TPZCompMesh>::~TPZAutoPointer(&this->fCMeshLagrange);
  TPZAutoPointer<TPZCompMesh>::~TPZAutoPointer(this_00);
  TPZAutoPointer<TPZGeoMesh>::~TPZAutoPointer(&this->fGMesh);
  return;
}

Assistant:

TPZMHMeshControl::~TPZMHMeshControl()
{
    fGMesh->ResetReference();
    int64_t nel = fCMesh->NElements();
    for (int64_t el = 0; el<nel ; el++) {
        TPZCompEl *cel = fCMesh->Element(el);
        if(!cel) continue;
        TPZSubCompMesh *subcmesh = dynamic_cast<TPZSubCompMesh *>(cel);
        if (!subcmesh) {
            continue;
        }
        delete cel;
    }
    for (int64_t el = 0; el<nel ; el++) {
        TPZCompEl *cel = fCMesh->Element(el);
        if(!cel) continue;
        TPZGeoEl *gel = cel->Reference();
        if (!gel) {
            continue;
        }
        cel->LoadElementReference();
        delete cel;
    }
}